

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::Finish
          (FlatBufferBuilderImpl<true> *this,uoffset_t root,char *file_identifier,bool size_prefix)

{
  uoffset_t element;
  size_t elem_size;
  long lVar1;
  size_t sVar2;
  SizeT element_00;
  size_t file_id_size;
  size_t root_offset_size;
  size_t prefix_size;
  bool size_prefix_local;
  char *file_identifier_local;
  uoffset_t root_local;
  FlatBufferBuilderImpl<true> *this_local;
  
  if (((this->finished ^ 0xffU) & 1) == 0) {
    __assert_fail("!finished",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x4ec,
                  "void flatbuffers::FlatBufferBuilderImpl<true>::Finish(uoffset_t, const char *, bool) [Is64Aware = true]"
                 );
  }
  NotNested(this);
  vector_downward<unsigned_long>::clear_scratch(&this->buf_);
  elem_size = 0;
  if (size_prefix) {
    elem_size = 8;
  }
  TrackMinAlign(this,elem_size);
  lVar1 = 0;
  if (file_identifier != (char *)0x0) {
    lVar1 = 4;
  }
  PreAlign(this,elem_size + 4 + lVar1,this->minalign_);
  if (file_identifier != (char *)0x0) {
    sVar2 = strlen(file_identifier);
    if (sVar2 != 4) {
      __assert_fail("strlen(file_identifier) == kFileIdentifierLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                    ,0x4fc,
                    "void flatbuffers::FlatBufferBuilderImpl<true>::Finish(uoffset_t, const char *, bool) [Is64Aware = true]"
                   );
    }
    PushBytes(this,(uint8_t *)file_identifier,4);
  }
  element = ReferTo(this,root);
  PushElement<unsigned_int,unsigned_int>(this,element);
  if (size_prefix) {
    element_00 = GetSize(this);
    PushElement<unsigned_long,unsigned_int>(this,element_00);
  }
  this->finished = true;
  return;
}

Assistant:

void Finish(uoffset_t root, const char *file_identifier, bool size_prefix) {
    // A buffer can only be finished once. To reuse a builder use `clear()`.
    FLATBUFFERS_ASSERT(!finished);

    NotNested();
    buf_.clear_scratch();

    const size_t prefix_size = size_prefix ? sizeof(SizeT) : 0;
    // Make sure we track the alignment of the size prefix.
    TrackMinAlign(prefix_size);

    const size_t root_offset_size = sizeof(uoffset_t);
    const size_t file_id_size = file_identifier ? kFileIdentifierLength : 0;

    // This will cause the whole buffer to be aligned.
    PreAlign(prefix_size + root_offset_size + file_id_size, minalign_);

    if (file_identifier) {
      FLATBUFFERS_ASSERT(strlen(file_identifier) == kFileIdentifierLength);
      PushBytes(reinterpret_cast<const uint8_t *>(file_identifier),
                kFileIdentifierLength);
    }
    PushElement(ReferTo(root));  // Location of root.
    if (size_prefix) { PushElement(GetSize()); }
    finished = true;
  }